

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O2

void __thiscall
r_memory_map::r_memory_map
          (r_memory_map *this,int fd,uint64_t offset,uint64_t len,uint32_t prot,uint32_t flags,
          uint64_t mapOffset)

{
  int __flags;
  void *pvVar1;
  runtime_error *this_00;
  
  this->_vptr_r_memory_map = (_func_int **)&PTR__r_memory_map_0010fd60;
  this->_mem = (void *)0x0;
  this->_length = len;
  this->_mapOffset = mapOffset;
  if (fd < 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Attempting to memory map a bad file descriptor.");
  }
  else if (len == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Attempting to memory map 0 bytes is invalid.");
  }
  else if ((flags & 3) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "A mapping must be either a file mapping, or an anonymous mapping (neither was specified)."
              );
  }
  else {
    if ((flags & 0x10) == 0) {
      __flags = _get_posix_access_flags(this,flags);
      pvVar1 = mmap64((void *)0x0,len,prot & 7,__flags,fd,offset);
      this->_mem = pvVar1;
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"r_memory_map does not support fixed mappings.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

r_memory_map::r_memory_map(int fd, uint64_t offset, uint64_t len, uint32_t prot, uint32_t flags, uint64_t mapOffset) :
    _mem(NULL),
    _length(len),
    _mapOffset(mapOffset)
{
    if(fd <= 0)
        throw runtime_error("Attempting to memory map a bad file descriptor.");

    if(len == 0)
        throw runtime_error("Attempting to memory map 0 bytes is invalid.");

    if(!(flags & MM_TYPE_FILE) && !(flags & MM_TYPE_ANON))
        throw runtime_error("A mapping must be either a file mapping, or an anonymous mapping (neither was specified).");

    if(flags & MM_FIXED)
        throw runtime_error("r_memory_map does not support fixed mappings.");

    _mem = mmap64(NULL, _length, _get_posix_prot_flags(prot), _get_posix_access_flags(flags), fd, offset);
}